

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall boost::runtime::parameters_store::add(parameters_store *this,basic_param *in)

{
  _Rb_tree_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>
  _Var1;
  byte bVar2;
  long *in_RSI;
  basic_cstring<const_char> *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_cstring<const_char>,_shared_ptr<basic_param>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  basic_param_ptr p;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar4;
  std_string *in_stack_fffffffffffffe78;
  specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>
  *in_stack_fffffffffffffec8;
  
  this_00 = (specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> *)
            &stack0xffffffffffffffe0;
  (**(code **)(*in_RSI + 0x10))();
  shared_ptr<boost::runtime::basic_param>::operator->
            ((shared_ptr<boost::runtime::basic_param> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  unit_test::basic_cstring<const_char>::basic_cstring(in_RDI,in_stack_fffffffffffffe78);
  std::
  make_pair<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>&>
            ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
             (shared_ptr<boost::runtime::basic_param> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  _Var3 = std::
          map<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>,boost::runtime::parameters_store::lg_compare,std::allocator<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::shared_ptr<boost::runtime::basic_param>>>>
          ::
          insert<std::pair<boost::unit_test::basic_cstring<char_const>,boost::shared_ptr<boost::runtime::basic_param>>>
                    ((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>,_boost::runtime::parameters_store::lg_compare,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>_>_>
                      *)in_RDI,
                     (pair<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>
                      *)in_stack_fffffffffffffe78);
  _Var1 = _Var3.first._M_node;
  bVar2 = _Var3.second;
  uVar4 = bVar2;
  std::
  pair<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>
  ::~pair((pair<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::basic_param>_>
           *)0x2601bc);
  if ((bVar2 & 1) != 0) {
    shared_ptr<boost::runtime::basic_param>::~shared_ptr
              ((shared_ptr<boost::runtime::basic_param> *)0x260325);
    return;
  }
  unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)CONCAT17(uVar4,CONCAT16(bVar2,in_stack_fffffffffffffe70)))
  ;
  duplicate_param::duplicate_param((duplicate_param *)in_RDI,(cstring *)_Var1._M_node);
  specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::operator<<
            (this_00,(char *)in_RDI);
  shared_ptr<boost::runtime::basic_param>::operator->
            ((shared_ptr<boost::runtime::basic_param> *)
             CONCAT17(uVar4,CONCAT16(bVar2,in_stack_fffffffffffffe70)));
  specific_param_error<boost::runtime::duplicate_param,boost::runtime::init_error>::operator<<
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::operator<<
            (this_00,(char *)in_RDI);
  unit_test::ut_detail::throw_exception<boost::runtime::duplicate_param>((duplicate_param *)in_RDI);
}

Assistant:

void                    add( basic_param const& in )
    {
        basic_param_ptr p = in.clone();

        BOOST_TEST_I_ASSRT( m_parameters.insert( std::make_pair( cstring(p->p_name), p ) ).second,
                            duplicate_param() << "Parameter " << p->p_name << " is duplicate." );
    }